

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_vss.cpp
# Opt level: O2

void __thiscall edk2_vss_t::vss_variable_t::_read(vss_variable_t *this)

{
  string *psVar1;
  vss_variable_attributes_t *pvVar2;
  kstream *pkVar3;
  uint8_t uVar4;
  bool bVar5;
  uint32_t uVar6;
  int iVar7;
  vss_variable_attributes_t *this_00;
  validation_expr_error<unsigned_int> *pvVar8;
  validation_expr_error<unsigned_char> *this_01;
  validation_expr_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pvVar9;
  uint uVar10;
  allocator local_121;
  string _;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  uVar4 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_signature_first = uVar4;
  this->n_signature_last = true;
  if (uVar4 == 0xaa) {
    this->n_signature_last = false;
    uVar4 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_signature_last = uVar4;
    if (uVar4 != 'U') {
      this_01 = (validation_expr_error<unsigned_char> *)__cxa_allocate_exception(0x40);
      _._M_dataplus._M_p._0_1_ = this->m_signature_last;
      pkVar3 = (this->super_kstruct).m__io;
      std::__cxx11::string::string
                ((string *)&local_40,"/types/vss_variable/seq/1",(allocator *)&local_100);
      kaitai::validation_expr_error<unsigned_char>::validation_expr_error
                (this_01,(uchar *)&_,pkVar3,&local_40);
      __cxa_throw(this_01,&kaitai::validation_expr_error<unsigned_char>::typeinfo,
                  kaitai::kstruct_error::~kstruct_error);
    }
    this->n_state = true;
    if (this->m_signature_first == 0xaa) {
      this->n_state = false;
      uVar4 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
      this->m_state = uVar4;
      this->n_reserved = true;
      if (this->m_signature_first != 0xaa) goto LAB_0013b17b;
      this->n_reserved = false;
      uVar4 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
      this->m_reserved = uVar4;
      this->n_attributes = true;
      if (this->m_signature_first != 0xaa) goto LAB_0013b1c3;
      this->n_attributes = false;
      this_00 = (vss_variable_attributes_t *)operator_new(0x38);
      vss_variable_attributes_t::vss_variable_attributes_t
                (this_00,(this->super_kstruct).m__io,this,this->m__root);
      pvVar2 = (this->m_attributes)._M_t.
               super___uniq_ptr_impl<edk2_vss_t::vss_variable_attributes_t,_std::default_delete<edk2_vss_t::vss_variable_attributes_t>_>
               ._M_t.
               super__Tuple_impl<0UL,_edk2_vss_t::vss_variable_attributes_t_*,_std::default_delete<edk2_vss_t::vss_variable_attributes_t>_>
               .super__Head_base<0UL,_edk2_vss_t::vss_variable_attributes_t_*,_false>._M_head_impl;
      (this->m_attributes)._M_t.
      super___uniq_ptr_impl<edk2_vss_t::vss_variable_attributes_t,_std::default_delete<edk2_vss_t::vss_variable_attributes_t>_>
      ._M_t.
      super__Tuple_impl<0UL,_edk2_vss_t::vss_variable_attributes_t_*,_std::default_delete<edk2_vss_t::vss_variable_attributes_t>_>
      .super__Head_base<0UL,_edk2_vss_t::vss_variable_attributes_t_*,_false>._M_head_impl = this_00;
      if (pvVar2 != (vss_variable_attributes_t *)0x0) {
        (**(code **)((long)(pvVar2->super_kstruct)._vptr_kstruct + 8))();
      }
      goto LAB_0013b17f;
    }
    this->n_reserved = true;
    this->n_attributes = true;
LAB_0013b1c3:
    this->n_len_total = true;
LAB_0013b1da:
    this->n_len_name = true;
    if (this->m_signature_first == 0xaa) {
      bVar5 = is_intel_legacy(this);
      if (!bVar5) {
        this->n_len_name = false;
        uVar6 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
        this->m_len_name = uVar6;
      }
      goto LAB_0013b201;
    }
    this->n_len_data = true;
LAB_0013b234:
    this->n_timestamp = true;
    if (this->m_signature_first == 0xaa) {
      bVar5 = is_auth(this);
      if (bVar5) {
        this->n_timestamp = false;
        kaitai::kstream::read_bytes_abi_cxx11_(&_,(this->super_kstruct).m__io,0x10);
        std::__cxx11::string::operator=((string *)&this->m_timestamp,(string *)&_);
        std::__cxx11::string::~string((string *)&_);
      }
      goto LAB_0013b277;
    }
    this->n_pubkey_index = true;
LAB_0013b2ad:
    this->n_len_name_auth = true;
    if (this->m_signature_first == 0xaa) {
      bVar5 = is_auth(this);
      if (bVar5) {
        this->n_len_name_auth = false;
        uVar6 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
        this->m_len_name_auth = uVar6;
        if ((uVar6 < 4) || (iVar7 = kaitai::kstream::mod(uVar6,2), iVar7 != 0)) {
          pvVar8 = (validation_expr_error<unsigned_int> *)__cxa_allocate_exception(0x40);
          _._M_dataplus._M_p._0_4_ = this->m_len_name_auth;
          pkVar3 = (this->super_kstruct).m__io;
          std::__cxx11::string::string
                    ((string *)&local_80,"/types/vss_variable/seq/10",(allocator *)&local_100);
          kaitai::validation_expr_error<unsigned_int>::validation_expr_error
                    (pvVar8,(uint *)&_,pkVar3,&local_80);
          __cxa_throw(pvVar8,&kaitai::validation_expr_error<unsigned_int>::typeinfo,
                      kaitai::kstruct_error::~kstruct_error);
        }
      }
      goto LAB_0013b2f9;
    }
    this->n_len_data_auth = true;
LAB_0013b3bd:
    this->n_vendor_guid = true;
    if (this->m_signature_first == 0xaa) {
      this->n_vendor_guid = false;
      kaitai::kstream::read_bytes_abi_cxx11_(&_,(this->super_kstruct).m__io,0x10);
      std::__cxx11::string::operator=((string *)&this->m_vendor_guid,(string *)&_);
      std::__cxx11::string::~string((string *)&_);
      this->n_name_auth = true;
      if (this->m_signature_first != 0xaa) goto LAB_0013b452;
      bVar5 = is_auth(this);
      if (bVar5) {
        this->n_name_auth = false;
        kaitai::kstream::read_bytes_abi_cxx11_
                  (&_,(this->super_kstruct).m__io,(ulong)this->m_len_name_auth);
        std::__cxx11::string::operator=((string *)&this->m_name_auth,(string *)&_);
        std::__cxx11::string::~string((string *)&_);
      }
    }
    else {
      this->n_name_auth = true;
    }
    this->n_data_auth = true;
    if (this->m_signature_first == 0xaa) {
      bVar5 = is_auth(this);
      if (bVar5) {
        this->n_data_auth = false;
        kaitai::kstream::read_bytes_abi_cxx11_
                  (&_,(this->super_kstruct).m__io,(ulong)this->m_len_data_auth);
        std::__cxx11::string::operator=((string *)&this->m_data_auth,(string *)&_);
        std::__cxx11::string::~string((string *)&_);
      }
      goto LAB_0013b459;
    }
    this->n_apple_data_crc32 = true;
LAB_0013b51f:
    this->n_intel_legacy_data = true;
    if (this->m_signature_first != 0xaa) {
      this->n_name = true;
      goto LAB_0013b620;
    }
    bVar5 = is_intel_legacy(this);
    if (bVar5) {
      this->n_intel_legacy_data = false;
      pkVar3 = (this->super_kstruct).m__io;
      if (this->f_len_intel_legacy_header == true) {
        iVar7 = (int)this->m_len_intel_legacy_header;
      }
      else {
        this->f_len_intel_legacy_header = true;
        this->m_len_intel_legacy_header = '\x1c';
        iVar7 = 0x1c;
      }
      kaitai::kstream::read_bytes_abi_cxx11_(&_,pkVar3,(ulong)(this->m_len_total - iVar7));
      std::__cxx11::string::operator=((string *)&this->m_intel_legacy_data,(string *)&_);
      std::__cxx11::string::~string((string *)&_);
    }
  }
  else {
    this->n_state = true;
    this->n_reserved = true;
LAB_0013b17b:
    this->n_attributes = true;
LAB_0013b17f:
    this->n_len_total = true;
    if (this->m_signature_first == 0xaa) {
      bVar5 = is_intel_legacy(this);
      if (bVar5) {
        this->n_len_total = false;
        uVar6 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
        this->m_len_total = uVar6;
        if (this->f_len_intel_legacy_header == true) {
          uVar10 = (int)this->m_len_intel_legacy_header + 5;
        }
        else {
          this->f_len_intel_legacy_header = true;
          this->m_len_intel_legacy_header = '\x1c';
          uVar10 = 0x21;
        }
        if (uVar6 < uVar10) {
          pvVar8 = (validation_expr_error<unsigned_int> *)__cxa_allocate_exception(0x40);
          _._M_dataplus._M_p._0_4_ = this->m_len_total;
          pkVar3 = (this->super_kstruct).m__io;
          std::__cxx11::string::string
                    ((string *)&local_60,"/types/vss_variable/seq/5",(allocator *)&local_100);
          kaitai::validation_expr_error<unsigned_int>::validation_expr_error
                    (pvVar8,(uint *)&_,pkVar3,&local_60);
          __cxa_throw(pvVar8,&kaitai::validation_expr_error<unsigned_int>::typeinfo,
                      kaitai::kstruct_error::~kstruct_error);
        }
      }
      goto LAB_0013b1da;
    }
    this->n_len_name = true;
LAB_0013b201:
    this->n_len_data = true;
    if (this->m_signature_first == 0xaa) {
      bVar5 = is_intel_legacy(this);
      if (!bVar5) {
        this->n_len_data = false;
        uVar6 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
        this->m_len_data = uVar6;
      }
      goto LAB_0013b234;
    }
    this->n_timestamp = true;
LAB_0013b277:
    this->n_pubkey_index = true;
    if (this->m_signature_first == 0xaa) {
      bVar5 = is_auth(this);
      if (bVar5) {
        this->n_pubkey_index = false;
        uVar6 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
        this->m_pubkey_index = uVar6;
      }
      goto LAB_0013b2ad;
    }
    this->n_len_name_auth = true;
LAB_0013b2f9:
    this->n_len_data_auth = true;
    if (this->m_signature_first == 0xaa) {
      bVar5 = is_auth(this);
      if (bVar5) {
        this->n_len_data_auth = false;
        uVar6 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
        this->m_len_data_auth = uVar6;
        if (uVar6 == 0) {
          pvVar8 = (validation_expr_error<unsigned_int> *)__cxa_allocate_exception(0x40);
          _._M_dataplus._M_p._0_4_ = this->m_len_data_auth;
          pkVar3 = (this->super_kstruct).m__io;
          std::__cxx11::string::string
                    ((string *)&local_a0,"/types/vss_variable/seq/11",(allocator *)&local_100);
          kaitai::validation_expr_error<unsigned_int>::validation_expr_error
                    (pvVar8,(uint *)&_,pkVar3,&local_a0);
          __cxa_throw(pvVar8,&kaitai::validation_expr_error<unsigned_int>::typeinfo,
                      kaitai::kstruct_error::~kstruct_error);
        }
      }
      goto LAB_0013b3bd;
    }
    this->n_vendor_guid = true;
    this->n_name_auth = true;
LAB_0013b452:
    this->n_data_auth = true;
LAB_0013b459:
    this->n_apple_data_crc32 = true;
    if (this->m_signature_first == 0xaa) {
      bVar5 = is_intel_legacy(this);
      if (((!bVar5) && (bVar5 = is_auth(this), !bVar5)) &&
         (((this->m_attributes)._M_t.
           super___uniq_ptr_impl<edk2_vss_t::vss_variable_attributes_t,_std::default_delete<edk2_vss_t::vss_variable_attributes_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_edk2_vss_t::vss_variable_attributes_t_*,_std::default_delete<edk2_vss_t::vss_variable_attributes_t>_>
           .super__Head_base<0UL,_edk2_vss_t::vss_variable_attributes_t_*,_false>._M_head_impl)->
          m_apple_data_checksum == true)) {
        this->n_apple_data_crc32 = false;
        uVar6 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
        this->m_apple_data_crc32 = uVar6;
      }
      goto LAB_0013b51f;
    }
    this->n_intel_legacy_data = true;
  }
  this->n_name = true;
  if (this->m_signature_first != 0xaa) {
    this->n_data = true;
    return;
  }
  bVar5 = is_intel_legacy(this);
  if ((!bVar5) && (bVar5 = is_auth(this), !bVar5)) {
    this->n_name = false;
    kaitai::kstream::read_bytes_abi_cxx11_(&_,(this->super_kstruct).m__io,(ulong)this->m_len_name);
    psVar1 = &this->m_name;
    std::__cxx11::string::operator=((string *)psVar1,(string *)&_);
    std::__cxx11::string::~string((string *)&_);
    std::__cxx11::string::string((string *)&_,(string *)psVar1);
    if ((this->m_len_name < 4) || (iVar7 = kaitai::kstream::mod(this->m_len_name,2), iVar7 != 0)) {
      pvVar9 = (validation_expr_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)__cxa_allocate_exception(0x40);
      std::__cxx11::string::string((string *)&local_100,(string *)psVar1);
      pkVar3 = (this->super_kstruct).m__io;
      std::__cxx11::string::string((string *)&local_c0,"/types/vss_variable/seq/17",&local_121);
      kaitai::
      validation_expr_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::validation_expr_error(pvVar9,&local_100,pkVar3,&local_c0);
      __cxa_throw(pvVar9,&kaitai::validation_expr_error<std::__cxx11::string>::typeinfo,
                  kaitai::kstruct_error::~kstruct_error);
    }
    std::__cxx11::string::~string((string *)&_);
  }
LAB_0013b620:
  this->n_data = true;
  if (((this->m_signature_first == 0xaa) && (bVar5 = is_intel_legacy(this), !bVar5)) &&
     (bVar5 = is_auth(this), !bVar5)) {
    this->n_data = false;
    kaitai::kstream::read_bytes_abi_cxx11_(&_,(this->super_kstruct).m__io,(ulong)this->m_len_data);
    psVar1 = &this->m_data;
    std::__cxx11::string::operator=((string *)psVar1,(string *)&_);
    std::__cxx11::string::~string((string *)&_);
    std::__cxx11::string::string((string *)&_,(string *)psVar1);
    if (this->m_len_name == 0) {
      pvVar9 = (validation_expr_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)__cxa_allocate_exception(0x40);
      std::__cxx11::string::string((string *)&local_100,(string *)psVar1);
      pkVar3 = (this->super_kstruct).m__io;
      std::__cxx11::string::string((string *)&local_e0,"/types/vss_variable/seq/18",&local_121);
      kaitai::
      validation_expr_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::validation_expr_error(pvVar9,&local_100,pkVar3,&local_e0);
      __cxa_throw(pvVar9,&kaitai::validation_expr_error<std::__cxx11::string>::typeinfo,
                  kaitai::kstruct_error::~kstruct_error);
    }
    std::__cxx11::string::~string((string *)&_);
  }
  return;
}

Assistant:

void edk2_vss_t::vss_variable_t::_read() {
    m_signature_first = m__io->read_u1();
    n_signature_last = true;
    if (signature_first() == 170) {
        n_signature_last = false;
        m_signature_last = m__io->read_u1();
        {
            uint8_t _ = signature_last();
            if (!(_ == 85)) {
                throw kaitai::validation_expr_error<uint8_t>(signature_last(), _io(), std::string("/types/vss_variable/seq/1"));
            }
        }
    }
    n_state = true;
    if (signature_first() == 170) {
        n_state = false;
        m_state = m__io->read_u1();
    }
    n_reserved = true;
    if (signature_first() == 170) {
        n_reserved = false;
        m_reserved = m__io->read_u1();
    }
    n_attributes = true;
    if (signature_first() == 170) {
        n_attributes = false;
        m_attributes = std::unique_ptr<vss_variable_attributes_t>(new vss_variable_attributes_t(m__io, this, m__root));
    }
    n_len_total = true;
    if ( ((signature_first() == 170) && (is_intel_legacy())) ) {
        n_len_total = false;
        m_len_total = m__io->read_u4le();
        {
            uint32_t _ = len_total();
            if (!(_ >= ((static_cast<uint32_t>(len_intel_legacy_header()) + 4) + 1))) {
                throw kaitai::validation_expr_error<uint32_t>(len_total(), _io(), std::string("/types/vss_variable/seq/5"));
            }
        }
    }
    n_len_name = true;
    if ( ((signature_first() == 170) && (!(is_intel_legacy()))) ) {
        n_len_name = false;
        m_len_name = m__io->read_u4le();
    }
    n_len_data = true;
    if ( ((signature_first() == 170) && (!(is_intel_legacy()))) ) {
        n_len_data = false;
        m_len_data = m__io->read_u4le();
    }
    n_timestamp = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_timestamp = false;
        m_timestamp = m__io->read_bytes(16);
    }
    n_pubkey_index = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_pubkey_index = false;
        m_pubkey_index = m__io->read_u4le();
    }
    n_len_name_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_len_name_auth = false;
        m_len_name_auth = m__io->read_u4le();
        {
            uint32_t _ = len_name_auth();
            if (!( ((_ >= 4) && (kaitai::kstream::mod(_, 2) == 0)) )) {
                throw kaitai::validation_expr_error<uint32_t>(len_name_auth(), _io(), std::string("/types/vss_variable/seq/10"));
            }
        }
    }
    n_len_data_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_len_data_auth = false;
        m_len_data_auth = m__io->read_u4le();
        {
            uint32_t _ = len_data_auth();
            if (!(_ > 0)) {
                throw kaitai::validation_expr_error<uint32_t>(len_data_auth(), _io(), std::string("/types/vss_variable/seq/11"));
            }
        }
    }
    n_vendor_guid = true;
    if (signature_first() == 170) {
        n_vendor_guid = false;
        m_vendor_guid = m__io->read_bytes(16);
    }
    n_name_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_name_auth = false;
        m_name_auth = m__io->read_bytes(len_name_auth());
    }
    n_data_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_data_auth = false;
        m_data_auth = m__io->read_bytes(len_data_auth());
    }
    n_apple_data_crc32 = true;
    if ( ((signature_first() == 170) && (!(is_intel_legacy())) && (!(is_auth())) && (attributes()->apple_data_checksum())) ) {
        n_apple_data_crc32 = false;
        m_apple_data_crc32 = m__io->read_u4le();
    }
    n_intel_legacy_data = true;
    if ( ((signature_first() == 170) && (is_intel_legacy())) ) {
        n_intel_legacy_data = false;
        m_intel_legacy_data = m__io->read_bytes((len_total() - len_intel_legacy_header()));
    }
    n_name = true;
    if ( ((signature_first() == 170) && (!(is_intel_legacy())) && (!(is_auth()))) ) {
        n_name = false;
        m_name = m__io->read_bytes(len_name());
        {
            std::string _ = name();
            if (!( ((len_name() >= 4) && (kaitai::kstream::mod(len_name(), 2) == 0)) )) {
                throw kaitai::validation_expr_error<std::string>(name(), _io(), std::string("/types/vss_variable/seq/17"));
            }
        }
    }
    n_data = true;
    if ( ((signature_first() == 170) && (!(is_intel_legacy())) && (!(is_auth()))) ) {
        n_data = false;
        m_data = m__io->read_bytes(len_data());
        {
            std::string _ = data();
            if (!(len_name() > 0)) {
                throw kaitai::validation_expr_error<std::string>(data(), _io(), std::string("/types/vss_variable/seq/18"));
            }
        }
    }
}